

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O1

void * QArrayData::allocate2(QArrayData **dptr,qsizetype capacity,AllocationOption option)

{
  size_t sVar1;
  QArrayData *pQVar2;
  size_t __size;
  void *pvVar3;
  CalculateGrowingBlockSizeResult CVar4;
  
  if (capacity != 0) {
    if (option == Grow) {
      CVar4 = qCalculateGrowingBlockSize(capacity,2,0x12);
      capacity = CVar4.elementCount;
      __size = CVar4.size;
    }
    else {
      __size = 0xffffffffffffffff;
      if (-1 < capacity) {
        sVar1 = capacity * 2 + 0x12;
        if (((ulong)(capacity * 2) < 0xffffffffffffffee) && (-1 < (long)sVar1)) {
          __size = sVar1;
        }
      }
    }
    if (-1 < (long)__size) {
      pQVar2 = (QArrayData *)malloc(__size);
      if (pQVar2 == (QArrayData *)0x0) {
        pvVar3 = (void *)0x0;
      }
      else {
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i = 1;
        (pQVar2->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
        super_QFlagsStorage<QArrayData::ArrayOption>.i = 0;
        pvVar3 = (void *)((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0);
        pQVar2->alloc = capacity;
      }
      goto LAB_00105a55;
    }
  }
  pvVar3 = (void *)0x0;
  pQVar2 = (QArrayData *)0x0;
LAB_00105a55:
  *dptr = pQVar2;
  return pvVar3;
}

Assistant:

void *QArrayData::allocate2(QArrayData **dptr, qsizetype capacity, AllocationOption option) noexcept
{
    Q_ASSERT(dptr);

    auto r = allocateHelper(2, alignof(AlignedQArrayData), capacity, option);
    *dptr = r.header;
    return r.data;
}